

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_binbuf.c
# Opt level: O1

void binbuf_addbinbuf(_binbuf *x,_binbuf *y)

{
  bool bVar1;
  _binbuf *x_00;
  t_atom *ptVar2;
  byte *pbVar3;
  t_symbol *ptVar4;
  uint uVar5;
  int argc;
  char *s;
  int iVar6;
  char tbuf [1000];
  char local_418 [1000];
  
  x_00 = (_binbuf *)getbytes(0x10);
  x_00->b_n = 0;
  ptVar2 = (t_atom *)getbytes(0);
  x_00->b_vec = ptVar2;
  binbuf_add(x_00,y->b_n,y->b_vec);
  argc = x_00->b_n;
  if (argc < 1) {
LAB_0016936f:
    binbuf_add(x,argc,x_00->b_vec);
    freebytes(x_00->b_vec,(long)x_00->b_n << 4);
    freebytes(x_00,0x10);
    return;
  }
  ptVar2 = x_00->b_vec;
  iVar6 = 0;
LAB_001692b3:
  switch(ptVar2->a_type) {
  case A_FLOAT:
    break;
  case A_SYMBOL:
    pbVar3 = (byte *)((ptVar2->a_w).w_symbol)->s_name;
    bVar1 = false;
    do {
      uVar5 = *pbVar3 - 0x24;
      if ((uVar5 < 0x39) && ((0x100000000800101U >> ((ulong)uVar5 & 0x3f) & 1) != 0)) {
        bVar1 = true;
      }
      else if (*pbVar3 == 0) goto code_r0x001692ef;
      pbVar3 = pbVar3 + 1;
    } while( true );
  default:
    bug("binbuf_addbinbuf");
    break;
  case A_SEMI:
    ptVar2->a_type = A_SYMBOL;
    s = ";";
    goto LAB_00169354;
  case A_COMMA:
    ptVar2->a_type = A_SYMBOL;
    s = ",";
    goto LAB_00169354;
  case A_DOLLAR:
    sprintf(local_418,"$%d",(ulong)(uint)(ptVar2->a_w).w_index);
    goto LAB_0016931a;
  case A_DOLLSYM:
    goto switchD_001692c5_caseD_9;
  }
  goto switchD_001692c5_caseD_1;
code_r0x001692ef:
  if (bVar1) {
switchD_001692c5_caseD_9:
    atom_string(ptVar2,local_418,1000);
LAB_0016931a:
    ptVar2->a_type = A_SYMBOL;
    s = local_418;
LAB_00169354:
    ptVar4 = gensym(s);
    (ptVar2->a_w).w_symbol = ptVar4;
  }
switchD_001692c5_caseD_1:
  iVar6 = iVar6 + 1;
  ptVar2 = ptVar2 + 1;
  argc = x_00->b_n;
  if (argc <= iVar6) goto LAB_0016936f;
  goto LAB_001692b3;
}

Assistant:

void binbuf_addbinbuf(t_binbuf *x, const t_binbuf *y)
{
    t_binbuf *z = binbuf_new();
    int i, fixit;
    t_atom *ap;
    binbuf_add(z, y->b_n, y->b_vec);
    for (i = 0, ap = z->b_vec; i < z->b_n; i++, ap++)
    {
        char tbuf[MAXPDSTRING];
        const char *s;
        switch (ap->a_type)
        {
        case A_FLOAT:
            break;
        case A_SEMI:
            SETSYMBOL(ap, gensym(";"));
            break;
        case A_COMMA:
            SETSYMBOL(ap, gensym(","));
            break;
        case A_DOLLAR:
            sprintf(tbuf, "$%d", ap->a_w.w_index);
            SETSYMBOL(ap, gensym(tbuf));
            break;
        case A_DOLLSYM:
            atom_string(ap, tbuf, MAXPDSTRING);
            SETSYMBOL(ap, gensym(tbuf));
            break;
        case A_SYMBOL:
            for (s = ap->a_w.w_symbol->s_name, fixit = 0; *s; s++)
                if (*s == ';' || *s == ',' || *s == '$' || *s == '\\')
                    fixit = 1;
            if (fixit)
            {
                atom_string(ap, tbuf, MAXPDSTRING);
                SETSYMBOL(ap, gensym(tbuf));
            }
            break;
        default:
            bug("binbuf_addbinbuf");
        }
    }

    binbuf_add(x, z->b_n, z->b_vec);
    binbuf_free(z);
}